

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bqm.hpp
# Opt level: O1

void BQMTester<cimod::Dense>::test_DenseConstructionTest_Construction(void)

{
  double dVar1;
  mapped_type *pmVar2;
  mapped_type *rhs;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  __node_base _Var7;
  __node_base _Var8;
  long lVar9;
  pair<unsigned_int,_unsigned_int> indexpair;
  Vartype vartype;
  AssertionResult gtest_ar;
  double offset;
  Vartype bqm_vartype;
  BQM<uint32_t,_double,_cimod::Dense> bqm_k4;
  double bqm_offset;
  Quadratic<uint32_t,_double> quadratic;
  Quadratic<uint32_t,_double> bqm_quadratic;
  Linear<uint32_t,_double> linear;
  Linear<uint32_t,_double> bqm_linear;
  pair<unsigned_int,_unsigned_int> local_260;
  key_type local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 local_240;
  AssertHelper local_238;
  Vartype local_230;
  undefined1 local_229;
  undefined1 local_228 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_220;
  __node_base local_218;
  undefined1 auStack_210 [8];
  pointer local_208;
  pointer puStack_200;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1f8;
  double local_1c0;
  Vartype local_1b8;
  double local_1b0;
  double local_1a8;
  Vartype local_19c;
  undefined1 local_198 [48];
  undefined1 local_168 [40];
  size_t local_140;
  undefined1 local_138 [8];
  double local_130;
  Vartype local_128;
  double local_118;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_110;
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_d8;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_a0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  local_168._0_8_ = (__buckets_ptr)0x4;
  local_168._8_8_ = 0x4010000000000000;
  local_198._32_8_ = (pointer)0x3;
  local_198._40_8_ = &DAT_4008000000000000;
  local_198._16_8_ = 2;
  local_198._24_8_ = &DAT_4000000000000000;
  local_198._0_8_ = (double *)0x1;
  local_198._8_8_ = 0x3ff0000000000000;
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_Hashtable<std::pair<unsigned_int_const,double>const*>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,double>,std::allocator<std::pair<unsigned_int_const,double>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&local_a0,local_198,local_168 + 0x10,0,local_228,&local_110,&local_68);
  local_198._0_8_ = &DAT_200000001;
  local_198._8_8_ = 0x4028000000000000;
  local_198._16_8_ = 0x300000001;
  local_198._24_8_ = &DAT_402a000000000000;
  local_198._32_8_ = (pointer)0x400000001;
  local_198._40_8_ = (pointer)0x402c000000000000;
  local_168._0_8_ = (__buckets_ptr)0x300000002;
  local_168._8_8_ = 0x4037000000000000;
  local_168._16_8_ = (_Hash_node_base *)0x400000002;
  local_168._24_8_ = 0x4038000000000000;
  local_168._32_8_ = &DAT_400000003;
  local_140 = 0x4041000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_110,local_198,local_138,0,local_228,&local_68,&local_d8);
  local_1a8 = 0.0;
  local_230 = BINARY;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            ((BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_198,
             (Linear<unsigned_int,_double> *)&local_a0,(Quadratic<unsigned_int,_double> *)&local_110
             ,&local_1a8,BINARY);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::get_linear
            ((Linear<unsigned_int,_double> *)&local_68,
             (BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_198);
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_bucket_count = 1;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  if (local_198._32_8_ - local_198._24_8_ != 0) {
    uVar3 = (long)(local_198._32_8_ - local_198._24_8_) >> 2;
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar5 = uVar6 + 1;
      if (uVar5 < uVar3) {
        uVar3 = uVar5;
        if ((long)uVar6 < 0) goto LAB_00141016;
        do {
          if ((((long)uVar3 < 0) || ((long)local_198._8_8_ <= (long)uVar6)) ||
             ((long)local_198._16_8_ <= (long)uVar3)) goto LAB_00141016;
          dVar1 = *(double *)(local_198._0_8_ + uVar3 * 8 + local_198._16_8_ * lVar9);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            local_228._4_4_ = *(pointer)(local_198._24_8_ + uVar3 * 4);
            local_228._0_4_ = *(pointer)(local_198._24_8_ + uVar6 * 4);
            local_1b0 = dVar1;
            pmVar2 = std::__detail::
                     _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&local_d8,(key_type *)local_228);
            *pmVar2 = local_1b0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)((long)(local_198._32_8_ - local_198._24_8_) >> 2));
      }
      uVar3 = (long)(local_198._32_8_ - local_198._24_8_) >> 2;
      lVar9 = lVar9 + 8;
      uVar6 = uVar5;
    } while (uVar5 < uVar3);
  }
  local_118 = local_130;
  local_19c = local_128;
  if (local_68._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var7._M_nxt = local_68._M_before_begin._M_nxt;
    do {
      rhs = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&local_a0,(key_type *)(_Var7._M_nxt + 1));
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)local_228,"it.second","linear[it.first]",(double *)(_Var7._M_nxt + 2),
                 rhs);
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_258);
        pcVar4 = "";
        if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = (pbStack_220->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_260,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                   ,0x3d,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_258)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
        if (local_258 != (key_type)0x0) {
          (**(code **)(*(long *)local_258 + 8))();
        }
      }
      if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_220,pbStack_220);
      }
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt;
    } while (_Var7._M_nxt != (_Hash_node_base *)0x0);
  }
  if (local_d8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_d8._M_before_begin._M_nxt;
    do {
      pmVar2 = std::__detail::
               _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&local_110,(key_type *)(_Var8._M_nxt + 1));
      testing::internal::CmpHelperEQ<double,double>
                ((internal *)local_228,"it.second","quadratic[it.first]",
                 (double *)(_Var8._M_nxt + 2),pmVar2);
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_258);
        pcVar4 = "";
        if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = (pbStack_220->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_260,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                   ,0x42,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_258)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
        if (local_258 != (key_type)0x0) {
          (**(code **)(*(long *)local_258 + 8))();
        }
      }
      if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_220,pbStack_220);
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_228,"offset","bqm_offset",&local_1a8,&local_118);
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (pbStack_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_220->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x45,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if (local_258 != (key_type)0x0) {
      (**(code **)(*(long *)local_258 + 8))();
    }
  }
  if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_220,pbStack_220);
  }
  testing::internal::CmpHelperEQ<cimod::Vartype,cimod::Vartype>
            ((internal *)local_228,"vartype","bqm_vartype",&local_230,&local_19c);
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (pbStack_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_220->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x47,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_260,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_260);
    if (local_258 != (key_type)0x0) {
      (**(code **)(*(long *)local_258 + 8))();
    }
  }
  if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_220,pbStack_220);
  }
  local_228 = (undefined1  [8])&local_1f8;
  local_218._M_nxt = (_Hash_node_base *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  pbStack_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_208 = (pointer)0x3f800000;
  puStack_200 = (pointer)0x0;
  local_1f8._M_buckets = (__buckets_ptr)0x0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&local_a0,local_228);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_228);
  local_258 = (key_type)&DAT_400000003;
  local_250 = 0x4041000000000000;
  local_248 = 0x300000004;
  local_240 = 0x4041000000000000;
  std::
  _Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::pair<unsigned_int,unsigned_int>const,double>const*>
            ((_Hashtable<std::pair<unsigned_int,unsigned_int>,std::pair<std::pair<unsigned_int,unsigned_int>const,double>,std::allocator<std::pair<std::pair<unsigned_int,unsigned_int>const,double>>,std::__detail::_Select1st,std::equal_to<std::pair<unsigned_int,unsigned_int>>,cimod::pair_hash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_228,&local_258,&local_238,0,&local_260,&local_238,&local_229);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&local_110,local_228);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_228);
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            ((BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_228,
             (Linear<unsigned_int,_double> *)&local_a0,(Quadratic<unsigned_int,_double> *)&local_110
             ,&local_1a8,local_230);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_198,
             (Matrix<double,__1,__1,_1,__1,__1> *)local_228,(assign_op<double,_double> *)&local_258)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_198 + 0x18),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_210);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_168,&local_1f8);
  local_128 = local_1b8;
  local_130 = local_1c0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1f8);
  if (auStack_210 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_210,(long)puStack_200 - (long)auStack_210);
  }
  free((void *)local_228);
  pbStack_220 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  local_218._M_nxt = (_Hash_node_base *)0x0;
  auStack_210 = (undefined1  [8])0x0;
  local_208 = (pointer)CONCAT44(local_208._4_4_,1.0);
  puStack_200 = (pointer)0x0;
  local_1f8._M_buckets = (__buckets_ptr)0x0;
  local_228 = (undefined1  [8])&local_1f8;
  if (local_198._32_8_ - local_198._24_8_ != 0) {
    uVar3 = (long)(local_198._32_8_ - local_198._24_8_) >> 2;
    lVar9 = 0;
    uVar6 = 0;
    do {
      uVar5 = uVar6 + 1;
      if (uVar5 < uVar3) {
        uVar3 = uVar5;
        if ((long)uVar6 < 0) {
LAB_00141016:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 0]"
                       );
        }
        do {
          if ((((long)uVar3 < 0) || ((long)local_198._8_8_ <= (long)uVar6)) ||
             ((long)local_198._16_8_ <= (long)uVar3)) goto LAB_00141016;
          dVar1 = *(double *)(local_198._0_8_ + uVar3 * 8 + local_198._16_8_ * lVar9);
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            local_258.second = *(pointer)(local_198._24_8_ + uVar3 * 4);
            local_258.first = *(pointer)(local_198._24_8_ + uVar6 * 4);
            local_1b0 = dVar1;
            pmVar2 = std::__detail::
                     _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)local_228,&local_258);
            *pmVar2 = local_1b0;
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 < (ulong)((long)(local_198._32_8_ - local_198._24_8_) >> 2));
      }
      uVar3 = (long)(local_198._32_8_ - local_198._24_8_) >> 2;
      lVar9 = lVar9 + 8;
      uVar6 = uVar5;
    } while (uVar5 < uVar3);
  }
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign(&local_d8,local_228);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_228);
  local_260 = (pair<unsigned_int,_unsigned_int>)&DAT_400000003;
  if (local_d8._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    _Var8._M_nxt = local_d8._M_before_begin._M_nxt;
    do {
      testing::internal::
      CmpHelperEQ<std::pair<unsigned_int,unsigned_int>,std::pair<unsigned_int,unsigned_int>>
                ((internal *)local_228,"it.first","indexpair",
                 (pair<unsigned_int,_unsigned_int> *)(_Var8._M_nxt + 1),&local_260);
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_258);
        pcVar4 = "";
        if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = (pbStack_220->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                   ,0x51,pcVar4);
        testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_258);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        if (local_258 != (key_type)0x0) {
          (**(code **)(*(long *)local_258 + 8))();
        }
      }
      if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_220,pbStack_220);
      }
      testing::internal::CmpHelperFloatingPointEQ<double>
                ((internal *)local_228,"it.second","68.0",(double)_Var8._M_nxt[2]._M_nxt,68.0);
      if (local_228[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_258);
        pcVar4 = "";
        if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
          pcVar4 = (pbStack_220->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_238,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
                   ,0x52,pcVar4);
        testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_258);
        testing::internal::AssertHelper::~AssertHelper(&local_238);
        if (local_258 != (key_type)0x0) {
          (**(code **)(*(long *)local_258 + 8))();
        }
      }
      if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_220,pbStack_220);
      }
      _Var8._M_nxt = (_Var8._M_nxt)->_M_nxt;
    } while (_Var8._M_nxt != (_Hash_node_base *)0x0);
  }
  local_258.first = 0;
  local_258.second = 0;
  cimod::BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense>::BinaryQuadraticModel
            ((BinaryQuadraticModel<unsigned_int,_double,_cimod::Dense> *)local_228,
             (Linear<unsigned_int,_double> *)&local_a0,(Quadratic<unsigned_int,_double> *)&local_110
             ,(double *)&local_258,local_230);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_1,__1,__1> *)local_198,
             (Matrix<double,__1,__1,_1,__1,__1> *)local_228,(assign_op<double,_double> *)&local_258)
  ;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_198 + 0x18),
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)auStack_210);
  std::
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::
  _M_assign_elements<std::_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&>
            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_long>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)local_168,&local_1f8);
  local_128 = local_1b8;
  local_130 = local_1c0;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1f8);
  if (auStack_210 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_210,(long)puStack_200 - (long)auStack_210);
  }
  free((void *)local_228);
  local_258.first = 0;
  local_258.second = 0;
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)local_228,"offset","0.0",&local_1a8,(double *)&local_258);
  if (local_228[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_258);
    if (pbStack_220 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = (pbStack_220->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]cimod/tests/test_bqm.hpp"
               ,0x57,pcVar4);
    testing::internal::AssertHelper::operator=(&local_238,(Message *)&local_258);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    if (local_258 != (key_type)0x0) {
      (**(code **)(*(long *)local_258 + 8))();
    }
  }
  if (pbStack_220 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_220,pbStack_220);
  }
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_d8);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_long>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_168);
  if ((pointer)local_198._24_8_ != (pointer)0x0) {
    operator_delete((void *)local_198._24_8_,local_198._40_8_ - local_198._24_8_);
  }
  free((void *)local_198._0_8_);
  std::
  _Hashtable<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_cimod::pair_hash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_110);
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_double>,_std::allocator<std::pair<const_unsigned_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_a0);
  return;
}

Assistant:

static void test_DenseConstructionTest_Construction()
    {
        Linear<uint32_t, double> linear{ {1, 1.0}, {2, 2.0}, {3, 3.0}, {4, 4.0} };
        Quadratic<uint32_t, double> quadratic
        {
            {std::make_pair(1, 2), 12.0}, {std::make_pair(1, 3), 13.0}, {std::make_pair(1, 4), 14.0},
                {std::make_pair(2, 3), 23.0}, {std::make_pair(2, 4), 24.0},
                {std::make_pair(3, 4), 34.0}
        };
        double offset = 0.0;
        Vartype vartype = Vartype::BINARY;

        BQM<uint32_t, double, DataType> bqm_k4(linear, quadratic, offset, vartype);

        Linear<uint32_t, double> bqm_linear = bqm_k4.get_linear();
        Quadratic<uint32_t, double> bqm_quadratic = bqm_k4.get_quadratic();
        double bqm_offset = bqm_k4.get_offset();
        Vartype bqm_vartype = bqm_k4.get_vartype();

        // check linear
        for(auto &it : bqm_linear)
        {
            EXPECT_EQ(it.second, linear[it.first]);
        }
        // check quadratic
        for(auto &it : bqm_quadratic)
        {
            EXPECT_EQ(it.second, quadratic[it.first]);
        }
        // check offset
        EXPECT_EQ(offset, bqm_offset);
        // check vartype
        EXPECT_EQ(vartype, bqm_vartype);

        //reorder test
        linear = Linear<uint32_t, double>{};
        quadratic = Quadratic<uint32_t, double>{{std::make_pair(3, 4), 34.0}, {std::make_pair(4, 3), 34.0}};
        bqm_k4 = BQM<uint32_t, double, DataType>(linear, quadratic, offset, vartype);
        bqm_quadratic = bqm_k4.get_quadratic();
        std::pair<uint32_t, uint32_t> indexpair = std::make_pair(3,4);
        for(auto &it : bqm_quadratic)
        {
            EXPECT_EQ(it.first , indexpair);
            EXPECT_DOUBLE_EQ(it.second, 68.0);
        }

        //another constructor
        bqm_k4 = BQM<uint32_t, double, DataType>(linear, quadratic, vartype);
        EXPECT_EQ(offset, 0.0);
    }